

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O0

void basic_test(fdb_encryption_algorithm_t encryption)

{
  filemgr *pfVar1;
  uint in_EDI;
  filemgr_open_result fVar2;
  filemgr_open_result result;
  char buf [256];
  char *dbheader2;
  char *dbheader;
  filemgr_config config;
  filemgr *file;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  err_log_callback *in_stack_00000420;
  char *in_stack_00000428;
  undefined1 in_stack_00000437;
  filemgr *in_stack_00000438;
  undefined1 inc_revnum;
  char *len;
  void *in_stack_fffffffffffffde8;
  filemgr *in_stack_fffffffffffffdf0;
  filemgr *file_00;
  char local_1d8 [264];
  filemgr *local_d0;
  char *local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b0;
  undefined2 local_a0;
  uint local_9c;
  undefined1 auStack_98 [56];
  filemgr *local_60;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  uint local_4;
  
  local_4 = in_EDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  local_c8 = "dbheader";
  local_d0 = (filemgr *)0x12700d;
  memset(&local_c0,0,0x60);
  local_c0 = 0x1000;
  local_bc = 0x400;
  local_b0 = 8;
  local_a0 = 8;
  local_9c = local_4;
  memset(auStack_98,0x55,0x20);
  get_filemgr_ops();
  filemgr_open((char *)config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i,
               (filemgr_ops *)config.encryption_key.bytes._24_8_,
               (filemgr_config *)config.encryption_key.bytes._16_8_,
               (err_log_callback *)config.encryption_key.bytes._8_8_);
  get_filemgr_ops();
  fVar2 = filemgr_open((char *)config.block_reusing_threshold.super___atomic_base<unsigned_long>.
                               _M_i,(filemgr_ops *)config.encryption_key.bytes._24_8_,
                       (filemgr_config *)config.encryption_key.bytes._16_8_,
                       (err_log_callback *)config.encryption_key.bytes._8_8_);
  pfVar1 = fVar2.file;
  len = local_c8;
  local_60 = pfVar1;
  strlen(local_c8);
  inc_revnum = (undefined1)((ulong)pfVar1 >> 0x38);
  filemgr_update_header
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(size_t)len,(bool)inc_revnum);
  filemgr_close(in_stack_00000438,(bool)in_stack_00000437,in_stack_00000428,in_stack_00000420);
  get_filemgr_ops();
  fVar2 = filemgr_open((char *)config.block_reusing_threshold.super___atomic_base<unsigned_long>.
                               _M_i,(filemgr_ops *)config.encryption_key.bytes._24_8_,
                       (filemgr_config *)config.encryption_key.bytes._16_8_,
                       (err_log_callback *)config.encryption_key.bytes._8_8_);
  local_60 = fVar2.file;
  memcpy(local_1d8,(local_60->header).data,(ulong)(local_60->header).size);
  printf("%s\n",local_1d8);
  pfVar1 = local_60;
  file_00 = local_d0;
  strlen((char *)local_d0);
  filemgr_update_header(file_00,pfVar1,(size_t)len,(bool)inc_revnum);
  filemgr_close(in_stack_00000438,(bool)in_stack_00000437,in_stack_00000428,in_stack_00000420);
  sprintf(local_1d8,"basic test, encryption=%d",(ulong)local_4);
  if (basic_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n",local_1d8);
  }
  else {
    fprintf(_stderr,"%s PASSED\n",local_1d8);
  }
  return;
}

Assistant:

void basic_test(fdb_encryption_algorithm_t encryption)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    const char *dbheader = "dbheader";
    const char *dbheader2 = "dbheader2222222222";
    char buf[256];

    memset(&config, 0, sizeof(config));
    config.blocksize = 4096;
    config.ncacheblock = 1024;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;

    config.encryption_key.algorithm = encryption;
    memset(&config.encryption_key.bytes, 0x55, sizeof(config.encryption_key.bytes));

    filemgr_open_result result = filemgr_open((char *) "./filemgr_testfile",
                                              get_filemgr_ops(), &config, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    filemgr_update_header(file, (void*)dbheader, strlen(dbheader)+1, true);

    filemgr_close(file, true, NULL, NULL);
    result = filemgr_open((char *) "./filemgr_testfile", get_filemgr_ops(), &config, NULL);
    file = result.file;

    memcpy(buf, file->header.data, file->header.size);
    printf("%s\n", buf);

    filemgr_update_header(file, (void*)dbheader2, strlen(dbheader2) + 1, true);

    filemgr_close(file, true, NULL, NULL);

    sprintf(buf, "basic test, encryption=%d", (int)encryption);
    TEST_RESULT(buf);
}